

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-cursor.c
# Opt level: O2

int read_partial_array(coda_cursor *cursor,long offset,long length,void *dst)

{
  ushort *puVar1;
  coda_backend cVar2;
  coda_type_class cVar3;
  coda_dynamic_type_struct *pcVar4;
  long lVar5;
  int iVar6;
  coda_dynamic_type_struct *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  size_t __n;
  bool bVar14;
  void *local_60;
  
  pcVar4 = cursor->stack[(long)cursor->n + -1].type;
  if (pcVar4[1].backend != 2) {
    __assert_fail("variable->tag == tag_cdf_variable",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                  ,0x128,"int read_partial_array(const coda_cursor *, long, long, void *)");
  }
  lVar12 = (long)*(int *)((long)&pcVar4[2].definition + 4);
  cVar2 = pcVar4[3].backend;
  pcVar7 = *(coda_dynamic_type_struct **)(pcVar4 + 2);
  if (*(coda_dynamic_type_struct **)(pcVar4 + 2) == (coda_dynamic_type_struct *)0x0) {
    pcVar7 = pcVar4;
  }
  cVar3 = pcVar7->definition->type_class;
  lVar9 = length + offset;
  lVar13 = 0;
  lVar10 = (long)(int)(offset / lVar12);
  do {
    if ((int)(lVar9 / lVar12) < lVar10) {
      lVar12 = 0;
      if ((cVar3 != coda_text_class) && (*(int *)&cursor->product[1].field_0x14 != 1)) {
        lVar12 = 0;
        local_60 = dst;
        switch(pcVar4[3].backend) {
        case coda_backend_binary:
          break;
        case 2:
          lVar12 = 0;
          if (length < 1) {
            length = 0;
          }
          for (lVar9 = 0; length != lVar9; lVar9 = lVar9 + 1) {
            puVar1 = (ushort *)((long)dst + lVar9 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          }
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cdf-cursor.c"
                        ,0x17b,"int read_partial_array(const coda_cursor *, long, long, void *)");
        case 4:
          lVar12 = 0;
          if (length < 1) {
            length = 0;
          }
          while (bVar14 = length != 0, length = length + -1, bVar14) {
            swap4(local_60);
            local_60 = (void *)((long)local_60 + 4);
          }
          break;
        case 8:
          lVar12 = 0;
          if (length < 1) {
            length = lVar12;
          }
          while (bVar14 = length != 0, length = length + -1, bVar14) {
            swap8(local_60);
            local_60 = (void *)((long)local_60 + 8);
          }
        }
      }
switchD_0017e20d_caseD_1:
      return (int)lVar12;
    }
    lVar5 = *(long *)(*(long *)(pcVar4 + 4) + lVar10 * 8);
    if (lVar5 < 0) {
      coda_set_error(-200,"Missing record not supported for CDF variable");
LAB_0017e247:
      lVar12 = -1;
      goto switchD_0017e20d_caseD_1;
    }
    lVar8 = (long)*(int *)((long)&pcVar4[2].definition + 4);
    lVar11 = lVar10 * lVar8;
    __n = (int)cVar2 * lVar12;
    if (lVar9 < (lVar10 + 1) * lVar8) {
      __n = (long)(int)pcVar4[3].backend * (lVar9 - lVar11);
    }
    if (offset - lVar11 == 0 || offset < lVar11) {
      lVar8 = 0;
    }
    else {
      lVar8 = (offset - lVar11) * (long)(int)pcVar4[3].backend;
      __n = __n - lVar8;
    }
    if (pcVar4[4].definition == (coda_type *)0x0) {
      iVar6 = read_bytes((coda_product *)cursor->product[1].filename,lVar8 + lVar5,__n,
                         (void *)((long)dst + lVar13));
      if (iVar6 != 0) goto LAB_0017e247;
    }
    else {
      memcpy((void *)((long)dst + lVar13),
             (void *)((long)&(pcVar4[4].definition)->format + lVar8 + lVar5),__n);
    }
    lVar13 = lVar13 + __n;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

static int read_partial_array(const coda_cursor *cursor, long offset, long length, void *dst)
{
    coda_netcdf_array *type;
    coda_netcdf_product *product;
    long value_size;
    long i;

    type = (coda_netcdf_array *)cursor->stack[cursor->n - 1].type;
    product = (coda_netcdf_product *)cursor->product;

    value_size = (long)(type->base_type->definition->bit_size >> 3);
    if (type->base_type->record_var)
    {
        long num_blocks = type->definition->dim[0];
        long num_values_per_block;
        int64_t target_offset;

        num_values_per_block = type->definition->num_elements / num_blocks;
        target_offset = 0;

        for (i = 0; i < num_blocks; i++)
        {
            int64_t local_offset = 0;   /* byte offset within record */
            int64_t local_size = num_values_per_block * value_size;     /* amount of bytes to read */

            if (offset + length < (i + 1) * num_values_per_block)
            {
                local_size = (offset + length - i * num_values_per_block) * value_size;
            }
            if (offset > i * num_values_per_block)
            {
                local_offset = (offset - i * num_values_per_block) * value_size;
                local_size -= local_offset;
            }
            if (read_bytes(product->raw_product, type->base_type->offset + i * product->record_size + local_offset,
                           local_size, &((uint8_t *)dst)[target_offset]) != 0)
            {
                return -1;
            }
            target_offset += local_size;
        }

    }
    else
    {
        if (read_bytes(product->raw_product, type->base_type->offset + offset * value_size, length * value_size,
                       (uint8_t *)dst) != 0)
        {
            return -1;
        }
    }

#ifndef WORDS_BIGENDIAN
    switch (type->base_type->definition->bit_size)
    {
        case 8:
            /* no endianness conversion needed */
            break;
        case 16:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap2(&((int16_t *)dst)[i]);
            }
            break;
        case 32:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap4(&((int32_t *)dst)[i]);
            }
            break;
        case 64:
            for (i = 0; i < type->definition->num_elements; i++)
            {
                swap8(&((int64_t *)dst)[i]);
            }
            break;
        default:
            assert(0);
            exit(1);
    }
#endif

    return 0;
}